

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalSelectDeferred(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3TokenAndCost *aTC,int nTC)

{
  byte *pbVar1;
  Fts3Table *pTab;
  Fts3PhraseToken *pFVar2;
  Fts3MultiSegReader *pCsr_00;
  sqlite3_stmt *pStmt_00;
  int iVar3;
  int iVar4;
  Mem *pVal;
  byte *pbVar5;
  ulong uVar6;
  Fts3DeferredToken *pFVar7;
  long lVar8;
  long lVar9;
  Fts3TokenAndCost *pFVar10;
  int iVar11;
  byte *pbVar12;
  uchar *pStart;
  byte bVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  Fts3TokenAndCost *pFVar18;
  long in_FS_OFFSET;
  bool bVar19;
  Fts3Table *p;
  int nList;
  sqlite3_stmt *pStmt;
  int local_8c;
  int local_44;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTab = (Fts3Table *)(pCsr->base).pVtab;
  iVar3 = 0;
  if (pTab->zContentTbl != (char *)0x0) goto LAB_001cc4e8;
  iVar3 = 0;
  if (nTC < 1) {
    bVar19 = true;
    iVar15 = 0;
  }
  else {
    lVar8 = 0;
    iVar15 = 0;
    iVar11 = 0;
    do {
      if (*(Fts3Expr **)((long)&aTC->pRoot + lVar8) == pRoot) {
        iVar11 = iVar11 + *(int *)((long)&aTC->nOvfl + lVar8);
        iVar15 = iVar15 + 1;
      }
      lVar8 = lVar8 + 0x28;
    } while ((ulong)(uint)nTC * 0x28 != lVar8);
    bVar19 = iVar11 == 0;
  }
  if ((bool)(iVar15 < 2 | bVar19)) goto LAB_001cc4e8;
  iVar11 = 0;
  if (pCsr->nRowAvg == 0) {
    local_40 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
    iVar11 = sqlite3Fts3SelectDoctotal(pTab,&local_40);
    pStmt_00 = local_40;
    local_8c = 0;
    if (iVar11 == 0) {
      lVar8 = 0;
      pVal = columnMem(local_40,0);
      pbVar5 = (byte *)sqlite3_value_blob(pVal);
      columnMallocFailure(pStmt_00);
      if (pbVar5 == (byte *)0x0) {
LAB_001cc636:
        lVar9 = 0;
      }
      else {
        lVar8 = 0;
        iVar3 = sqlite3_column_bytes(pStmt_00,0);
        pbVar1 = pbVar5 + iVar3;
        iVar11 = (int)pbVar5 + 10;
        uVar6 = 0xfffffffffffffff9;
        pbVar12 = pbVar5;
        do {
          if (pbVar12 < pbVar1) {
            uVar17 = (uint)*pbVar12;
          }
          else {
            uVar17 = 0;
          }
          uVar6 = uVar6 + 7;
          lVar8 = lVar8 + ((ulong)(uVar17 & 0x7f) << ((byte)uVar6 & 0x3f));
          pbVar12 = pbVar12 + 1;
          if (uVar17 < 0x80) {
            iVar11 = (int)pbVar12;
            break;
          }
        } while (uVar6 < 0x39);
        lVar9 = (long)(iVar11 - (int)pbVar5);
        if (iVar3 <= lVar9) goto LAB_001cc636;
        pbVar5 = pbVar5 + lVar9;
        do {
          iVar3 = (int)pbVar5 + 10;
          uVar6 = 0xfffffffffffffff9;
          lVar9 = 0;
          pbVar12 = pbVar5;
          do {
            if (pbVar12 < pbVar1) {
              uVar17 = (uint)*pbVar12;
            }
            else {
              uVar17 = 0;
            }
            uVar6 = uVar6 + 7;
            lVar9 = lVar9 + ((ulong)(uVar17 & 0x7f) << ((byte)uVar6 & 0x3f));
            pbVar12 = pbVar12 + 1;
            if (uVar17 < 0x80) {
              iVar3 = (int)pbVar12;
              break;
            }
          } while (uVar6 < 0x39);
          pbVar5 = pbVar5 + (iVar3 - (int)pbVar5);
        } while (pbVar5 < pbVar1);
      }
      iVar3 = (int)pbVar5;
      if ((lVar8 == 0) || (lVar9 == 0)) {
        sqlite3_reset(pStmt_00);
        iVar3 = 0x10b;
        iVar11 = 0;
        bVar19 = false;
      }
      else {
        pCsr->nDoc = lVar8;
        pCsr->nRowAvg = (int)((lVar9 / lVar8 + (long)pTab->nPgsz) / (long)pTab->nPgsz);
        iVar11 = sqlite3_reset(pStmt_00);
        bVar19 = true;
      }
    }
    else {
      bVar19 = false;
      iVar3 = iVar11;
    }
    if (bVar19) goto LAB_001cc690;
  }
  else {
LAB_001cc690:
    local_8c = pCsr->nRowAvg;
    iVar3 = iVar11;
  }
  if ((0 < iVar15) && (iVar3 == 0)) {
    iVar11 = 0;
    iVar16 = 1;
    uVar17 = 0;
    do {
      if (nTC < 1) {
        pFVar18 = (Fts3TokenAndCost *)0x0;
      }
      else {
        pFVar18 = (Fts3TokenAndCost *)0x0;
        uVar6 = (ulong)(uint)nTC;
        pFVar10 = aTC;
        do {
          if (((pFVar10->pToken != (Fts3PhraseToken *)0x0) && (pFVar10->pRoot == pRoot)) &&
             ((pFVar18 == (Fts3TokenAndCost *)0x0 || (pFVar10->nOvfl < pFVar18->nOvfl)))) {
            pFVar18 = pFVar10;
          }
          pFVar10 = pFVar10 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      if (uVar17 == 0) {
LAB_001cc747:
        if (uVar17 < 0xc) {
          iVar16 = iVar16 * 4;
        }
        if ((uVar17 == 0) || ((iVar3 = 0, 1 < pFVar18->pPhrase->nToken && (uVar17 != iVar15 - 1U))))
        {
          local_44 = 0;
          local_40 = (sqlite3_stmt *)0x0;
          iVar3 = fts3TermSelect(pTab,pFVar18->pToken,pFVar18->iCol,&local_44,(char **)&local_40);
          if (iVar3 == 0) {
            iVar3 = fts3EvalPhraseMergeToken
                              (pTab,pFVar18->pPhrase,pFVar18->iToken,(char *)local_40,local_44);
          }
          if (iVar3 == 0) {
            pbVar5 = (byte *)(pFVar18->pPhrase->doclist).aAll;
            iVar4 = 0;
            if ((pbVar5 != (byte *)0x0) &&
               (lVar8 = (long)(pFVar18->pPhrase->doclist).nAll, iVar4 = 0, 0 < lVar8)) {
              iVar4 = 0;
              pbVar1 = pbVar5;
              do {
                do {
                  pbVar12 = pbVar1;
                  pbVar1 = pbVar12 + 1;
                } while ((char)*pbVar12 < '\0');
                bVar13 = pbVar12[1];
                if (bVar13 != 0) {
                  do {
                    pbVar1 = pbVar12 + 2;
                    bVar14 = bVar13 & 0x80;
                    pbVar12 = pbVar12 + 1;
                    bVar13 = *pbVar1;
                  } while (bVar14 != 0 || *pbVar1 != 0);
                }
                iVar4 = iVar4 + 1;
                pbVar1 = pbVar12 + 2;
              } while (pbVar12 + 2 < pbVar5 + lVar8);
            }
            if (iVar4 < iVar11) {
              iVar11 = iVar4;
            }
            if (uVar17 == 0) {
              iVar11 = iVar4;
            }
          }
        }
      }
      else {
        iVar3 = iVar16 + 3;
        if (-1 < iVar16) {
          iVar3 = iVar16;
        }
        if (pFVar18->nOvfl < ((iVar11 + (iVar3 >> 2) + -1) / (iVar3 >> 2)) * local_8c)
        goto LAB_001cc747;
        pFVar2 = pFVar18->pToken;
        iVar3 = pFVar18->iCol;
        iVar4 = sqlite3_initialize();
        if (iVar4 == 0) {
          pFVar7 = (Fts3DeferredToken *)sqlite3Malloc(0x20);
        }
        else {
          pFVar7 = (Fts3DeferredToken *)0x0;
        }
        if (pFVar7 == (Fts3DeferredToken *)0x0) {
          iVar3 = 7;
        }
        else {
          pFVar7->pToken = (Fts3PhraseToken *)0x0;
          *(undefined8 *)&pFVar7->iCol = 0;
          pFVar7->pNext = (Fts3DeferredToken *)0x0;
          pFVar7->pList = (PendingList *)0x0;
          pFVar7->pToken = pFVar2;
          pFVar7->pNext = pCsr->pDeferred;
          pFVar7->iCol = iVar3;
          pCsr->pDeferred = pFVar7;
          pFVar2->pDeferred = pFVar7;
          iVar3 = 0;
        }
        pCsr_00 = pFVar2->pSegcsr;
        sqlite3Fts3SegReaderFinish(pCsr_00);
        sqlite3_free(pCsr_00);
        pFVar2->pSegcsr = (Fts3MultiSegReader *)0x0;
      }
      pFVar18->pToken = (Fts3PhraseToken *)0x0;
      uVar17 = uVar17 + 1;
    } while (((int)uVar17 < iVar15) && (iVar3 == 0));
  }
LAB_001cc4e8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int fts3EvalSelectDeferred(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Consider tokens with this root node */
  Fts3TokenAndCost *aTC,          /* Array of expression tokens and costs */
  int nTC                         /* Number of entries in aTC[] */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int nDocSize = 0;               /* Number of pages per doc loaded */
  int rc = SQLITE_OK;             /* Return code */
  int ii;                         /* Iterator variable for various purposes */
  int nOvfl = 0;                  /* Total overflow pages used by doclists */
  int nToken = 0;                 /* Total number of tokens in cluster */

  int nMinEst = 0;                /* The minimum count for any phrase so far. */
  int nLoad4 = 1;                 /* (Phrases that will be loaded)^4. */

  /* Tokens are never deferred for FTS tables created using the content=xxx
  ** option. The reason being that it is not guaranteed that the content
  ** table actually contains the same data as the index. To prevent this from
  ** causing any problems, the deferred token optimization is completely
  ** disabled for content=xxx tables. */
  if( pTab->zContentTbl ){
    return SQLITE_OK;
  }

  /* Count the tokens in this AND/NEAR cluster. If none of the doclists
  ** associated with the tokens spill onto overflow pages, or if there is
  ** only 1 token, exit early. No tokens to defer in this case. */
  for(ii=0; ii<nTC; ii++){
    if( aTC[ii].pRoot==pRoot ){
      nOvfl += aTC[ii].nOvfl;
      nToken++;
    }
  }
  if( nOvfl==0 || nToken<2 ) return SQLITE_OK;

  /* Obtain the average docsize (in pages). */
  rc = fts3EvalAverageDocsize(pCsr, &nDocSize);
  assert( rc!=SQLITE_OK || nDocSize>0 );


  /* Iterate through all tokens in this AND/NEAR cluster, in ascending order
  ** of the number of overflow pages that will be loaded by the pager layer
  ** to retrieve the entire doclist for the token from the full-text index.
  ** Load the doclists for tokens that are either:
  **
  **   a. The cheapest token in the entire query (i.e. the one visited by the
  **      first iteration of this loop), or
  **
  **   b. Part of a multi-token phrase.
  **
  ** After each token doclist is loaded, merge it with the others from the
  ** same phrase and count the number of documents that the merged doclist
  ** contains. Set variable "nMinEst" to the smallest number of documents in
  ** any phrase doclist for which 1 or more token doclists have been loaded.
  ** Let nOther be the number of other phrases for which it is certain that
  ** one or more tokens will not be deferred.
  **
  ** Then, for each token, defer it if loading the doclist would result in
  ** loading N or more overflow pages into memory, where N is computed as:
  **
  **    (nMinEst + 4^nOther - 1) / (4^nOther)
  */
  for(ii=0; ii<nToken && rc==SQLITE_OK; ii++){
    int iTC;                      /* Used to iterate through aTC[] array. */
    Fts3TokenAndCost *pTC = 0;    /* Set to cheapest remaining token. */

    /* Set pTC to point to the cheapest remaining token. */
    for(iTC=0; iTC<nTC; iTC++){
      if( aTC[iTC].pToken && aTC[iTC].pRoot==pRoot
       && (!pTC || aTC[iTC].nOvfl<pTC->nOvfl)
      ){
        pTC = &aTC[iTC];
      }
    }
    assert( pTC );

    if( ii && pTC->nOvfl>=((nMinEst+(nLoad4/4)-1)/(nLoad4/4))*nDocSize ){
      /* The number of overflow pages to load for this (and therefore all
      ** subsequent) tokens is greater than the estimated number of pages
      ** that will be loaded if all subsequent tokens are deferred.
      */
      Fts3PhraseToken *pToken = pTC->pToken;
      rc = sqlite3Fts3DeferToken(pCsr, pToken, pTC->iCol);
      fts3SegReaderCursorFree(pToken->pSegcsr);
      pToken->pSegcsr = 0;
    }else{
      /* Set nLoad4 to the value of (4^nOther) for the next iteration of the
      ** for-loop. Except, limit the value to 2^24 to prevent it from
      ** overflowing the 32-bit integer it is stored in. */
      if( ii<12 ) nLoad4 = nLoad4*4;

      if( ii==0 || (pTC->pPhrase->nToken>1 && ii!=nToken-1) ){
        /* Either this is the cheapest token in the entire query, or it is
        ** part of a multi-token phrase. Either way, the entire doclist will
        ** (eventually) be loaded into memory. It may as well be now. */
        Fts3PhraseToken *pToken = pTC->pToken;
        int nList = 0;
        char *pList = 0;
        rc = fts3TermSelect(pTab, pToken, pTC->iCol, &nList, &pList);
        assert( rc==SQLITE_OK || pList==0 );
        if( rc==SQLITE_OK ){
          rc = fts3EvalPhraseMergeToken(
              pTab, pTC->pPhrase, pTC->iToken,pList,nList
          );
        }
        if( rc==SQLITE_OK ){
          int nCount;
          nCount = fts3DoclistCountDocids(
              pTC->pPhrase->doclist.aAll, pTC->pPhrase->doclist.nAll
          );
          if( ii==0 || nCount<nMinEst ) nMinEst = nCount;
        }
      }
    }
    pTC->pToken = 0;
  }

  return rc;
}